

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Group.c
# Opt level: O1

Vec_Ptr_t * Llb_ManGroupCollect(Llb_Grp_t *pGroup)

{
  int iVar1;
  Vec_Ptr_t *vNodes;
  void **ppvVar2;
  long lVar3;
  Vec_Ptr_t *pVVar4;
  long lVar5;
  
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  vNodes->nCap = 100;
  vNodes->nSize = 0;
  ppvVar2 = (void **)malloc(800);
  vNodes->pArray = ppvVar2;
  Aig_ManIncrementTravId(pGroup->pMan->pAig);
  lVar3 = (long)pGroup->vIns->nSize;
  if (0 < lVar3) {
    ppvVar2 = pGroup->vIns->pArray;
    iVar1 = pGroup->pMan->pAig->nTravIds;
    lVar5 = 0;
    do {
      *(int *)((long)ppvVar2[lVar5] + 0x20) = iVar1;
      lVar5 = lVar5 + 1;
    } while (lVar3 != lVar5);
  }
  lVar3 = (long)pGroup->vOuts->nSize;
  if (0 < lVar3) {
    ppvVar2 = pGroup->vOuts->pArray;
    iVar1 = pGroup->pMan->pAig->nTravIds;
    lVar5 = 0;
    do {
      *(int *)((long)ppvVar2[lVar5] + 0x20) = iVar1 + -1;
      lVar5 = lVar5 + 1;
    } while (lVar3 != lVar5);
  }
  pVVar4 = pGroup->vOuts;
  if (0 < pVVar4->nSize) {
    lVar3 = 0;
    do {
      Llb_ManGroupCollect_rec(pGroup->pMan->pAig,(Aig_Obj_t *)pVVar4->pArray[lVar3],vNodes);
      lVar3 = lVar3 + 1;
      pVVar4 = pGroup->vOuts;
    } while (lVar3 < pVVar4->nSize);
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Llb_ManGroupCollect( Llb_Grp_t * pGroup )
{
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj;
    int i;
    vNodes = Vec_PtrAlloc( 100 );
    Aig_ManIncrementTravId( pGroup->pMan->pAig );
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vIns, pObj, i )
        Aig_ObjSetTravIdCurrent( pGroup->pMan->pAig, pObj );
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vOuts, pObj, i )
        Aig_ObjSetTravIdPrevious( pGroup->pMan->pAig, pObj );
    Vec_PtrForEachEntry( Aig_Obj_t *, pGroup->vOuts, pObj, i )
        Llb_ManGroupCollect_rec( pGroup->pMan->pAig, pObj, vNodes );
    return vNodes;
}